

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O3

void __thiscall
mp::internal::AffineExprExtractor::VisitCommonExpr(AffineExprExtractor *this,Reference e)

{
  int iVar1;
  ColProblem *pCVar2;
  pointer pLVar3;
  size_ty sVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pBVar7;
  size_t index;
  ulong uVar8;
  int *piVar9;
  int *piVar10;
  
  pCVar2 = this->sp_->problem_;
  uVar8 = (ulong)*(int *)((long)e.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.
                                super_ExprBase.impl_ + 4);
  pLVar3 = (pCVar2->super_Problem).linear_exprs_.
           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = *(size_ty *)
           ((long)&pLVar3[uVar8].terms_.
                   super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> + 0x10);
  if (sVar4 != 0) {
    piVar10 = *(int **)&pLVar3[uVar8].terms_.
                        super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>;
    piVar9 = piVar10 + sVar4 * 4;
    piVar5 = (this->sp_->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->coefs_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar1 = piVar5[*piVar10];
      pdVar6[iVar1] = *(double *)(piVar10 + 2) * this->coef_ + pdVar6[iVar1];
      piVar10 = piVar10 + 4;
    } while (piVar10 != piVar9);
  }
  pBVar7 = (pCVar2->super_Problem).nonlinear_exprs_.
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar8 < (ulong)((long)(pCVar2->super_Problem).nonlinear_exprs_.
                            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar7 >> 3)) {
    BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>::Visit
              ((BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes> *
               )this,(Expr)pBVar7[uVar8].super_ExprBase.impl_);
    return;
  }
  BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes> *)
             this,(Expr)0x0);
  return;
}

Assistant:

void AffineExprExtractor::VisitCommonExpr(Reference e) {
  auto common_expr = sp_.problem_.common_expr(e.index());
  const auto &linear = common_expr.linear_expr();
  for (auto i = linear.begin(), end = linear.end(); i != end; ++i)
    AddTerm(i->var_index(), i->coef());
  Visit(common_expr.nonlinear_expr());
}